

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O0

int mdb_env_set_mapsize(MDB_env *env,mdb_size_t size)

{
  int iVar1;
  MDB_meta *pMVar2;
  char *local_48;
  mdb_size_t minsize;
  int rc;
  void *old;
  MDB_meta *meta;
  mdb_size_t size_local;
  MDB_env *env_local;
  
  meta = (MDB_meta *)size;
  if (env->me_map != (char *)0x0) {
    if (env->me_txn != (MDB_txn *)0x0) {
      return 0x16;
    }
    pMVar2 = mdb_env_pick_meta(env);
    if (size == 0) {
      meta = (MDB_meta *)pMVar2->mm_mapsize;
    }
    pMVar2 = (MDB_meta *)((pMVar2->mm_last_pg + 1) * (ulong)env->me_psize);
    if (meta < pMVar2) {
      meta = pMVar2;
    }
    munmap(env->me_map,env->me_mapsize);
    env->me_mapsize = (mdb_size_t)meta;
    if ((env->me_flags & 1) == 0) {
      local_48 = (char *)0x0;
    }
    else {
      local_48 = env->me_map;
    }
    iVar1 = mdb_env_map(env,local_48);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  env->me_mapsize = (mdb_size_t)meta;
  if (env->me_psize != 0) {
    env->me_maxpg = env->me_mapsize / (ulong)env->me_psize;
  }
  return 0;
}

Assistant:

int ESECT
mdb_env_set_mapsize(MDB_env *env, mdb_size_t size)
{
	/* If env is already open, caller is responsible for making
	 * sure there are no active txns.
	 */
	if (env->me_map) {
		MDB_meta *meta;
#ifndef MDB_VL32
		void *old;
		int rc;
#endif
		if (env->me_txn)
			return EINVAL;
		meta = mdb_env_pick_meta(env);
		if (!size)
			size = meta->mm_mapsize;
		{
			/* Silently round up to minimum if the size is too small */
			mdb_size_t minsize = (meta->mm_last_pg + 1) * env->me_psize;
			if (size < minsize)
				size = minsize;
		}
#ifndef MDB_VL32
		/* For MDB_VL32 this bit is a noop since we dynamically remap
		 * chunks of the DB anyway.
		 */
		munmap(env->me_map, env->me_mapsize);
		env->me_mapsize = size;
		old = (env->me_flags & MDB_FIXEDMAP) ? env->me_map : NULL;
		rc = mdb_env_map(env, old);
		if (rc)
			return rc;
#endif /* !MDB_VL32 */
	}
	env->me_mapsize = size;
	if (env->me_psize)
		env->me_maxpg = env->me_mapsize / env->me_psize;
	return MDB_SUCCESS;
}